

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestPackage.cpp
# Opt level: O1

void __thiscall
tcu::TestPackageRoot::TestPackageRoot
          (TestPackageRoot *this,TestContext *testCtx,TestPackageRegistry *packageRegistry)

{
  pointer ppPVar1;
  TestNode *node;
  long lVar2;
  
  TestNode::TestNode(&this->super_TestNode,testCtx,NODETYPE_ROOT,"","");
  (this->super_TestNode)._vptr_TestNode = (_func_int **)&PTR__TestPackageRoot_00277610;
  ppPVar1 = (packageRegistry->m_packageInfos).
            super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(packageRegistry->m_packageInfos).
                              super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1) >> 3)) {
    lVar2 = 0;
    do {
      node = &(*ppPVar1[lVar2]->createFunc)(testCtx)->super_TestNode;
      TestNode::addChild(&this->super_TestNode,node);
      lVar2 = lVar2 + 1;
      ppPVar1 = (packageRegistry->m_packageInfos).
                super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar2 < (int)((ulong)((long)(packageRegistry->m_packageInfos).
                                         super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1)
                          >> 3));
  }
  return;
}

Assistant:

TestPackageRoot::TestPackageRoot (TestContext& testCtx, const TestPackageRegistry* packageRegistry)
	: TestNode(testCtx, NODETYPE_ROOT, "", "")
{
	const vector<TestPackageRegistry::PackageInfo*>&	packageInfos	= packageRegistry->getPackageInfos();

	for (int i = 0; i < (int)packageInfos.size(); i++)
		addChild(packageInfos[i]->createFunc(testCtx));
}